

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeSetCFLFraction(void *arkode_mem,sunrealtype cfl_frac)

{
  int iVar1;
  int line;
  int error_code;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem local_18;
  ARKodeHAdaptMem local_10;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"ARKodeSetCFLFraction",&local_18,&local_10);
  if (iVar1 == 0) {
    if (local_18->step_supports_adaptive == 0) {
      msgfmt = "time-stepping module does not support temporal adaptivity";
      iVar1 = -0x30;
      error_code = -0x30;
      line = 0x5fc;
    }
    else {
      if (cfl_frac < 1.0) {
        if (cfl_frac <= 0.0) {
          local_10->cfl = 0.5;
        }
        else {
          local_10->cfl = cfl_frac;
        }
        return 0;
      }
      msgfmt = "Illegal CFL fraction";
      iVar1 = -0x16;
      error_code = -0x16;
      line = 0x604;
    }
    arkProcessError(local_18,error_code,line,"ARKodeSetCFLFraction",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,msgfmt);
  }
  return iVar1;
}

Assistant:

int ARKodeSetCFLFraction(void* arkode_mem, sunrealtype cfl_frac)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* check for allowable parameters */
  if (cfl_frac >= ONE)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Illegal CFL fraction");
    return (ARK_ILL_INPUT);
  }

  /* set positive-valued parameters, otherwise set default */
  if (cfl_frac <= ZERO) { hadapt_mem->cfl = CFLFAC; }
  else { hadapt_mem->cfl = cfl_frac; }

  return (ARK_SUCCESS);
}